

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Visit.hpp
# Opt level: O2

void mserialize::detail::visit_arithmetic<mserialize::detail::IntegerToHex,InputStream>
               (char tag,IntegerToHex *visitor,InputStream *istream)

{
  int iVar1;
  runtime_error *this;
  undefined7 in_register_00000039;
  allocator local_95;
  uint8_t B;
  int8_t b;
  char c;
  bool y;
  uint16_t S;
  int16_t s;
  float f;
  uint32_t I;
  int32_t i;
  double d;
  uint64_t L;
  int64_t l;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  longdouble local_28;
  
  iVar1 = (int)CONCAT71(in_register_00000039,tag);
  switch(iVar1) {
  case 0x62:
    TrivialDeserializer<signed_char>::deserialize<InputStream>(&b,istream);
    IntegerToHex::visit<signed_char>(visitor,b);
    break;
  case 99:
    TrivialDeserializer<char>::deserialize<InputStream>(&c,istream);
    IntegerToHex::visit<char>(visitor,c);
    break;
  case 100:
    TrivialDeserializer<double>::deserialize<InputStream>(&d,istream);
    break;
  case 0x65:
  case 0x67:
  case 0x68:
  case 0x6a:
  case 0x6b:
switchD_0014bf67_caseD_65:
    this = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::string::string((string *)&local_68,"Invalid arithmetic tag: ",&local_95);
    std::operator+(&local_48,&local_68,tag);
    std::runtime_error::runtime_error(this,(string *)&local_48);
    __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  case 0x66:
    TrivialDeserializer<float>::deserialize<InputStream>(&f,istream);
    break;
  case 0x69:
    TrivialDeserializer<int>::deserialize<InputStream>(&i,istream);
    IntegerToHex::visit<int>(visitor,i);
    break;
  case 0x6c:
    TrivialDeserializer<long>::deserialize<InputStream>(&l,istream);
    IntegerToHex::visit<long>(visitor,l);
    break;
  default:
    if (iVar1 == 0x42) {
      TrivialDeserializer<unsigned_char>::deserialize<InputStream>(&B,istream);
      IntegerToHex::visit<unsigned_char>(visitor,B);
    }
    else if (iVar1 == 0x44) {
      TrivialDeserializer<long_double>::deserialize<InputStream>(&local_28,istream);
    }
    else if (iVar1 == 0x49) {
      TrivialDeserializer<unsigned_int>::deserialize<InputStream>(&I,istream);
      IntegerToHex::visit<unsigned_int>(visitor,I);
    }
    else if (iVar1 == 0x4c) {
      TrivialDeserializer<unsigned_long>::deserialize<InputStream>(&L,istream);
      IntegerToHex::visit<unsigned_long>(visitor,L);
    }
    else if (iVar1 == 0x53) {
      TrivialDeserializer<unsigned_short>::deserialize<InputStream>(&S,istream);
      IntegerToHex::visit<unsigned_short>(visitor,S);
    }
    else if (iVar1 == 0x73) {
      TrivialDeserializer<short>::deserialize<InputStream>(&s,istream);
      IntegerToHex::visit<short>(visitor,s);
    }
    else {
      if (iVar1 != 0x79) goto switchD_0014bf67_caseD_65;
      TrivialDeserializer<bool>::deserialize<InputStream>(&y,istream);
      visitor->_buffer[0x12] = y | 0x30;
      visitor->_p = visitor->_buffer + 0x12;
    }
  }
  return;
}

Assistant:

void visit_arithmetic(char tag, Visitor& visitor, InputStream& istream)
{
  switch(tag)
  {
  case 'y': bool y; mserialize::deserialize(y, istream); visitor.visit(y); break;
  case 'c': char c; mserialize::deserialize(c, istream); visitor.visit(c); break;

  case 'b': std::int8_t  b; mserialize::deserialize(b, istream); visitor.visit(b); break;
  case 's': std::int16_t s; mserialize::deserialize(s, istream); visitor.visit(s); break;
  case 'i': std::int32_t i; mserialize::deserialize(i, istream); visitor.visit(i); break;
  case 'l': std::int64_t l; mserialize::deserialize(l, istream); visitor.visit(l); break;

  case 'B': std::uint8_t  B; mserialize::deserialize(B, istream); visitor.visit(B); break;
  case 'S': std::uint16_t S; mserialize::deserialize(S, istream); visitor.visit(S); break;
  case 'I': std::uint32_t I; mserialize::deserialize(I, istream); visitor.visit(I); break;
  case 'L': std::uint64_t L; mserialize::deserialize(L, istream); visitor.visit(L); break;

  case 'f': float f;       mserialize::deserialize(f, istream); visitor.visit(f); break;
  case 'd': double d;      mserialize::deserialize(d, istream); visitor.visit(d); break;
  case 'D': long double D; mserialize::deserialize(D, istream); visitor.visit(D); break;
  default: throw std::runtime_error(std::string("Invalid arithmetic tag: ") + tag); break;
  }
}